

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryLayeredRenderingTests.cpp
# Opt level: O3

void vkt::geometry::anon_unknown_0::initPrograms
               (SourceCollections *programCollection,TestParams_conflict params)

{
  uint uVar1;
  ulong uVar2;
  SourceCollections *this;
  char *pcVar3;
  size_t sVar4;
  ProgramSources *pPVar5;
  ostream *poVar6;
  int precision;
  long lVar7;
  int iVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  string padding;
  ostringstream src;
  ostringstream src_1;
  ostringstream colorTable;
  undefined1 auStack_558 [15];
  char local_549;
  ulong local_548;
  string local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  ulong local_500;
  VkImageViewType local_4f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  long *local_4d0;
  long local_4c8;
  long local_4c0 [2];
  SourceCollections *local_4b0;
  uint local_4a8;
  undefined4 uStack_4a4;
  value_type local_4a0 [3];
  ios_base local_438 [264];
  uint local_330;
  undefined4 uStack_32c;
  value_type local_328 [3];
  ios_base local_2c0 [264];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_500 = (ulong)params.testType;
  bVar10 = params.testType == TEST_TYPE_ALL_LAYERS;
  bVar11 = params.testType == TEST_TYPE_INVOCATION_PER_LAYER;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4a8);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)auStack_558 + (int)*(undefined8 *)(CONCAT44(uStack_4a4,local_4a8) + -0x18)
                    + 0xb0);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4a8,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4a8,"void main(void)\n",0x10)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4a8,"}\n",2);
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"vert","");
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,local_1a8);
  std::__cxx11::stringbuf::str();
  local_330 = 0;
  local_328[0]._M_dataplus._M_p = (pointer)&local_328[0].field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_328,local_540._M_dataplus._M_p,
             local_540._M_dataplus._M_p + local_540._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar5->sources + local_330,local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328[0]._M_dataplus._M_p != &local_328[0].field_2) {
    operator_delete(local_328[0]._M_dataplus._M_p,local_328[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4a8);
  std::ios_base::~ios_base(local_438);
  local_4f4 = params.image.viewType;
  uVar1 = (&params.image.size.depth)[params.image.viewType != VK_IMAGE_VIEW_TYPE_3D];
  local_548 = (ulong)uVar1;
  iVar8 = (int)local_500;
  if ((iVar8 == 2) || (iVar8 == 4)) {
    iVar8 = uVar1 * 4;
  }
  else if (iVar8 == 3) {
    iVar8 = (uVar1 + 1) * uVar1;
  }
  else {
    iVar8 = (uint)(iVar8 == 6) * 2 + 4;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)auStack_558 + (int)*(undefined8 *)(CONCAT44(uStack_32c,local_330) + -0x18)
                    + 0x228);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"\n",1);
  poVar6 = (ostream *)&local_330;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  if ((int)local_500 - 5U < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,"layout(points, invocations = ",0x1d);
    poVar6 = (ostream *)std::ostream::operator<<(&local_330,(int)local_548);
    lVar7 = 6;
    pcVar3 = ") in;\n";
  }
  else {
    lVar7 = 0x13;
    pcVar3 = "layout(points) in;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar3,lVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_330,"layout(triangle_strip, max_vertices = ",0x26);
  poVar6 = (ostream *)std::ostream::operator<<(&local_330,iVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,") out;\n",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  local_549 = bVar10 || bVar11;
  pcVar3 = "layout(location = 0) out vec4 vert_color;\n\n";
  if (!bVar10 && !bVar11) {
    pcVar3 = "";
  }
  lVar7 = 0x2b;
  if (!bVar10 && !bVar11) {
    lVar7 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar3,lVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"out gl_PerVertex {\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    vec4 gl_Position;\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"};\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"void main(void)\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"{\n",2);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    const vec4 colors[",0x16);
  poVar6 = (ostream *)std::ostream::operator<<(local_1a8,6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] = vec4[",9);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"](",2);
  std::__cxx11::stringbuf::str();
  local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_520,(char)local_4a0[0]._M_dataplus._M_p);
  local_4b0 = programCollection;
  if ((size_type *)CONCAT44(uStack_4a4,local_4a8) != &local_4a0[0]._M_string_length) {
    operator_delete((undefined1 *)CONCAT44(uStack_4a4,local_4a8),local_4a0[0]._M_string_length + 1);
  }
  lVar7 = 0;
  do {
    if ((int)lVar7 == 0) {
      local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"");
    }
    else {
      std::operator+(&local_4f0,",\n",&local_520);
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
    local_1b8 = *(undefined8 *)(geometry::(anonymous_namespace)::s_colors + lVar7 * 0x10);
    uStack_1b0 = *(undefined8 *)(geometry::(anonymous_namespace)::s_colors + lVar7 * 0x10 + 8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4a8,"vec4(",5);
    lVar9 = 0;
    do {
      pcVar3 = ", ";
      if (lVar9 == 0) {
        pcVar3 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_4a8,pcVar3,(ulong)((uint)(lVar9 != 0) * 2));
      de::floatToString_abi_cxx11_
                (&local_540,(de *)&DAT_00000001,*(float *)((long)&local_1b8 + lVar9 * 4),precision);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_4a8,local_540._M_dataplus._M_p,local_540._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_540._M_dataplus._M_p != &local_540.field_2) {
        operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4a8,")",1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4a8);
    std::ios_base::~ios_base(local_438);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_4d0,local_4c8);
    if (local_4d0 != local_4c0) {
      operator_delete(local_4d0,local_4c0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,");\n",3);
  this = local_4b0;
  uVar2 = local_500;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  iVar8 = (int)uVar2;
  switch(uVar2 & 0xffffffff) {
  case 0:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,"    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,"    EmitVertex();\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,"    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,"    EmitVertex();\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,"    gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n",0x2e);
    pcVar3 = "    EmitVertex();\n";
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,"    EmitVertex();\n",0x12);
    poVar6 = (ostream *)&local_330;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    lVar7 = 0x12;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n",0x2e);
    break;
  case 1:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,"    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,"    gl_Layer    = ",0x12);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&local_330);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    EmitVertex();\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    gl_Layer    = ",0x12);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    EmitVertex();\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    gl_Layer    = ",0x12);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    EmitVertex();\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    gl_Layer    = ",0x12);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    EmitVertex();\n",0x12);
    goto switchD_009e545d_default;
  case 2:
    std::__cxx11::stringbuf::str();
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_330,(char *)CONCAT44(uStack_4a4,local_4a8),
                        (long)local_4a0[0]._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    for (int layerNdx = 0; layerNdx < ",0x26);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)local_548);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"; ++layerNdx) {\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"        const int colorNdx = layerNdx % ",0x28);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"        gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"        gl_Layer    = layerNdx;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"        vert_color  = colors[colorNdx];\n",0x28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        EmitVertex();\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"        gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"        gl_Layer    = layerNdx;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"        vert_color  = colors[colorNdx];\n",0x28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        EmitVertex();\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"        gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"        gl_Layer    = layerNdx;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"        vert_color  = colors[colorNdx];\n",0x28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        EmitVertex();\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"        gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"        gl_Layer    = layerNdx;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"        vert_color  = colors[colorNdx];\n",0x28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        EmitVertex();\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        EndPrimitive();\n",0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    };\n",7);
    goto LAB_009e5eca;
  case 3:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,"    for (int layerNdx = 0; layerNdx < ",0x26);
    poVar6 = (ostream *)std::ostream::operator<<(&local_330,(int)local_548);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"; ++layerNdx) {\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"        for (int colNdx = 0; colNdx <= layerNdx; ++colNdx) {\n",0x3d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"            const float posX = float(colNdx) / float(",0x35);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)local_548);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") * 2.0 - 1.0;\n",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"            gl_Position = vec4(posX,  1.0, 0.0, 1.0);\n",0x36);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"            gl_Layer    = layerNdx;\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"            EmitVertex();\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"            gl_Position = vec4(posX, -1.0, 0.0, 1.0);\n",0x36);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"            gl_Layer    = layerNdx;\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"            EmitVertex();\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        }\n",10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        EndPrimitive();\n",0x18);
    lVar7 = 6;
    pcVar3 = "    }\n";
    break;
  case 4:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,"    for (int layerNdx = 0; layerNdx < ",0x26);
    poVar6 = (ostream *)std::ostream::operator<<(&local_330,(int)local_548);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"; ++layerNdx) {\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"        gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"        gl_Layer    = layerNdx;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        EmitVertex();\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"        gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"        gl_Layer    = layerNdx;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        EmitVertex();\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"        gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"        gl_Layer    = layerNdx;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        EmitVertex();\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"        gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"        gl_Layer    = layerNdx;\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        EmitVertex();\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        EndPrimitive();\n",0x18);
    lVar7 = 7;
    pcVar3 = "    };\n";
    break;
  case 5:
    std::__cxx11::stringbuf::str();
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_330,(char *)CONCAT44(uStack_4a4,local_4a8),
                        (long)local_4a0[0]._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    const int colorNdx = gl_InvocationID % ",0x2b);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    gl_Layer    = gl_InvocationID;\n",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    vert_color  = colors[colorNdx];\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    EmitVertex();\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    gl_Layer    = gl_InvocationID;\n",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    vert_color  = colors[colorNdx];\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    EmitVertex();\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    gl_Layer    = gl_InvocationID;\n",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    vert_color  = colors[colorNdx];\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    EmitVertex();\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    gl_Layer    = gl_InvocationID;\n",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    vert_color  = colors[colorNdx];\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    EmitVertex();\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    EndPrimitive();\n",0x14);
LAB_009e5eca:
    if ((size_type *)CONCAT44(uStack_4a4,local_4a8) != &local_4a0[0]._M_string_length) {
      operator_delete((undefined1 *)CONCAT44(uStack_4a4,local_4a8),local_4a0[0]._M_string_length + 1
                     );
    }
    goto switchD_009e545d_default;
  case 6:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,"    const int   layerA = gl_InvocationID;\n",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,"    const int   layerB = (gl_InvocationID + 1) % ",0x31);
    poVar6 = (ostream *)std::ostream::operator<<(&local_330,(int)local_548);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,";\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    const float aEnd   = float(layerA) / float(",0x2f);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)local_548);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") * 2.0 - 1.0;\n",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    const float bEnd   = float(layerB) / float(",0x2f);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)local_548);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") * 2.0 - 1.0;\n",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    gl_Layer    = layerA;\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    EmitVertex();\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    gl_Layer    = layerA;\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    EmitVertex();\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    gl_Position = vec4(aEnd, -1.0, 0.0, 1.0);\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    gl_Layer    = layerA;\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    EmitVertex();\n",0x12);
    pcVar3 = "    EndPrimitive();\n";
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    EndPrimitive();\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    gl_Layer    = layerB;\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    EmitVertex();\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    gl_Position = vec4(bEnd,  1.0, 0.0, 1.0);\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    gl_Layer    = layerB;\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    EmitVertex();\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    gl_Position = vec4(bEnd, -1.0, 0.0, 1.0);\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    gl_Layer    = layerB;\n",0x1a);
    lVar7 = 0x14;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    EmitVertex();\n",0x12);
    break;
  default:
    goto switchD_009e545d_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar3,lVar7);
switchD_009e545d_default:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"}\n",2);
  local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"geom","");
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this->glslSources,&local_540);
  std::__cxx11::stringbuf::str();
  local_4a8 = 2;
  local_4a0[0]._M_dataplus._M_p = (pointer)&local_4a0[0].field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4a0,local_520._M_dataplus._M_p,
             local_520._M_dataplus._M_p + local_520._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar5->sources + local_4a8,local_4a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0[0]._M_dataplus._M_p != &local_4a0[0].field_2) {
    operator_delete(local_4a0[0]._M_dataplus._M_p,local_4a0[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_330);
  std::ios_base::~ios_base(local_2c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4a8);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)auStack_558 + (int)*(undefined8 *)(CONCAT44(uStack_4a4,local_4a8) + -0x18)
                    + 0xb0);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4a8,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_4a8,"layout(location = 0) out vec4 o_color;\n",0x27);
  pcVar3 = "";
  if (local_549 != '\0') {
    pcVar3 = "layout(location = 0) in  vec4 vert_color;\n";
  }
  lVar7 = 0x2a;
  if (local_549 == '\0') {
    lVar7 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4a8,pcVar3,lVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4a8,"void main(void)\n",0x10)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4a8,"{\n",2);
  if (params.testType == TEST_TYPE_LAYER_ID) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_4a8,"    o_color = vec4( (gl_Layer    % 2) == 1 ? 1.0 : 0.5,\n",
               0x38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_4a8,"                   ((gl_Layer/2) % 2) == 1 ? 1.0 : 0.5,\n",
               0x38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_4a8,"                     gl_Layer         == 0 ? 1.0 : 0.0,\n",
               0x38);
    lVar7 = 0x33;
    pcVar3 = "                                             1.0);\n";
  }
  else {
    lVar7 = 0x1a;
    pcVar3 = "    o_color = vert_color;\n";
    if ((iVar8 != 2) && (iVar8 != 5)) {
      lVar7 = 0x19;
      pcVar3 = "    o_color = vec4(1.0);\n";
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4a8,pcVar3,lVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4a8,"}\n",2);
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"frag","");
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this->glslSources,local_1a8);
  std::__cxx11::stringbuf::str();
  local_330 = 1;
  local_328[0]._M_dataplus._M_p = (pointer)&local_328[0].field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_328,local_540._M_dataplus._M_p,
             local_540._M_dataplus._M_p + local_540._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar5->sources + local_330,local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328[0]._M_dataplus._M_p != &local_328[0].field_2) {
    operator_delete(local_328[0]._M_dataplus._M_p,local_328[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4a8);
  std::ios_base::~ios_base(local_438);
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection, const TestParams params)
{
	const bool geomOutputColor = (params.testType == TEST_TYPE_ALL_LAYERS || params.testType == TEST_TYPE_INVOCATION_PER_LAYER);

	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Geometry shader
	{
		const int numLayers		= static_cast<int>(params.image.viewType == VK_IMAGE_VIEW_TYPE_3D ? params.image.size.depth : params.image.numLayers);

		const int maxVertices	= (params.testType == TEST_TYPE_DIFFERENT_CONTENT)										? (numLayers + 1) * numLayers :
								  (params.testType == TEST_TYPE_ALL_LAYERS || params.testType == TEST_TYPE_LAYER_ID)	? numLayers * 4 :
								  (params.testType == TEST_TYPE_MULTIPLE_LAYERS_PER_INVOCATION)							? 6 : 4;

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n";

		if (params.testType == TEST_TYPE_INVOCATION_PER_LAYER || params.testType == TEST_TYPE_MULTIPLE_LAYERS_PER_INVOCATION)
			src << "layout(points, invocations = " << numLayers << ") in;\n";
		else
			src << "layout(points) in;\n";

		src << "layout(triangle_strip, max_vertices = " << maxVertices << ") out;\n"
			<< "\n"
			<< (geomOutputColor ? "layout(location = 0) out vec4 vert_color;\n\n" : "")
			<< "out gl_PerVertex {\n"
			<< "    vec4 gl_Position;\n"
			<< "};\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n";

		std::ostringstream colorTable;
		{
			const int numColors = DE_LENGTH_OF_ARRAY(s_colors);

			colorTable << "    const vec4 colors[" << numColors << "] = vec4[" << numColors << "](";

			const std::string padding(colorTable.str().length(), ' ');

			for (int i = 0; i < numColors; ++i)
				colorTable << (i != 0 ? ",\n" + padding : "") << toGlsl(s_colors[i]);

			colorTable << ");\n";
		}

		if (params.testType == TEST_TYPE_DEFAULT_LAYER)
		{
			src << "    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n"
				<< "    EmitVertex();\n";
		}
		else if (params.testType == TEST_TYPE_SINGLE_LAYER)
		{
			const deUint32 targetLayer = getTargetLayer(params.image);

			src << "    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = " << targetLayer << ";\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = " << targetLayer << ";\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = " << targetLayer << ";\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = " << targetLayer << ";\n"
				<< "    EmitVertex();\n";
		}
		else if (params.testType == TEST_TYPE_ALL_LAYERS)
		{
			src << colorTable.str()
				<< "\n"
				<< "    for (int layerNdx = 0; layerNdx < " << numLayers << "; ++layerNdx) {\n"
				<< "        const int colorNdx = layerNdx % " << DE_LENGTH_OF_ARRAY(s_colors) << ";\n"
				<< "\n"
				<< "        gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n"
				<< "        gl_Layer    = layerNdx;\n"
				<< "        vert_color  = colors[colorNdx];\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n"
				<< "        gl_Layer    = layerNdx;\n"
				<< "        vert_color  = colors[colorNdx];\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n"
				<< "        gl_Layer    = layerNdx;\n"
				<< "        vert_color  = colors[colorNdx];\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n"
				<< "        gl_Layer    = layerNdx;\n"
				<< "        vert_color  = colors[colorNdx];\n"
				<< "        EmitVertex();\n"
				<< "        EndPrimitive();\n"
				<< "    };\n";
		}
		else if (params.testType == TEST_TYPE_LAYER_ID)
		{
			src << "    for (int layerNdx = 0; layerNdx < " << numLayers << "; ++layerNdx) {\n"
				<< "        gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n"
				<< "        gl_Layer    = layerNdx;\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n"
				<< "        gl_Layer    = layerNdx;\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n"
				<< "        gl_Layer    = layerNdx;\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n"
				<< "        gl_Layer    = layerNdx;\n"
				<< "        EmitVertex();\n"
				<< "        EndPrimitive();\n"
				<< "    };\n";
		}
		else if (params.testType == TEST_TYPE_DIFFERENT_CONTENT)
		{
			src << "    for (int layerNdx = 0; layerNdx < " << numLayers << "; ++layerNdx) {\n"
				<< "        for (int colNdx = 0; colNdx <= layerNdx; ++colNdx) {\n"
				<< "            const float posX = float(colNdx) / float(" << numLayers << ") * 2.0 - 1.0;\n"
				<< "\n"
				<< "            gl_Position = vec4(posX,  1.0, 0.0, 1.0);\n"
				<< "            gl_Layer    = layerNdx;\n"
				<< "            EmitVertex();\n"
				<< "\n"
				<< "            gl_Position = vec4(posX, -1.0, 0.0, 1.0);\n"
				<< "            gl_Layer    = layerNdx;\n"
				<< "            EmitVertex();\n"
				<< "        }\n"
				<< "        EndPrimitive();\n"
				<< "    }\n";
		}
		else if (params.testType == TEST_TYPE_INVOCATION_PER_LAYER)
		{
			src << colorTable.str()
				<< "    const int colorNdx = gl_InvocationID % " << DE_LENGTH_OF_ARRAY(s_colors) << ";\n"
				<< "\n"
				<< "    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = gl_InvocationID;\n"
				<< "    vert_color  = colors[colorNdx];\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = gl_InvocationID;\n"
				<< "    vert_color  = colors[colorNdx];\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = gl_InvocationID;\n"
				<< "    vert_color  = colors[colorNdx];\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = gl_InvocationID;\n"
				<< "    vert_color  = colors[colorNdx];\n"
				<< "    EmitVertex();\n"
				<< "    EndPrimitive();\n";
		}
		else if (params.testType == TEST_TYPE_MULTIPLE_LAYERS_PER_INVOCATION)
		{
			src << "    const int   layerA = gl_InvocationID;\n"
				<< "    const int   layerB = (gl_InvocationID + 1) % " << numLayers << ";\n"
				<< "    const float aEnd   = float(layerA) / float(" << numLayers << ") * 2.0 - 1.0;\n"
				<< "    const float bEnd   = float(layerB) / float(" << numLayers << ") * 2.0 - 1.0;\n"
				<< "\n"
				<< "    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = layerA;\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = layerA;\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4(aEnd, -1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = layerA;\n"
				<< "    EmitVertex();\n"
				<< "    EndPrimitive();\n"
				<< "\n"
				<< "    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = layerB;\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4(bEnd,  1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = layerB;\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4(bEnd, -1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = layerB;\n"
				<< "    EmitVertex();\n"
				<< "    EndPrimitive();\n";
		}
		else
			DE_ASSERT(0);

		src <<	"}\n";	// end main

		programCollection.glslSources.add("geom") << glu::GeometrySource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) out vec4 o_color;\n"
			<< (geomOutputColor ? "layout(location = 0) in  vec4 vert_color;\n" : "")
			<< "\n"
			<< "void main(void)\n"
			<< "{\n";

		if (params.testType == TEST_TYPE_LAYER_ID)
		{
			// This code must be in sync with verifyLayerContent()
			src << "    o_color = vec4( (gl_Layer    % 2) == 1 ? 1.0 : 0.5,\n"
				<< "                   ((gl_Layer/2) % 2) == 1 ? 1.0 : 0.5,\n"
				<< "                     gl_Layer         == 0 ? 1.0 : 0.0,\n"
				<< "                                             1.0);\n";
		}
		else if (geomOutputColor)
			src << "    o_color = vert_color;\n";
		else
			src << "    o_color = vec4(1.0);\n";

		src << "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}